

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

Optional<unsigned_long> __thiscall llvm::DWARFDie::getHighPC(DWARFDie *this,uint64_t LowPC)

{
  bool bVar1;
  DWARFFormValue *pDVar2;
  unsigned_long *puVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  Optional<unsigned_long> OVar5;
  unsigned_long local_78;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_70;
  Optional<unsigned_long> Offset;
  Optional<llvm::DWARFFormValue> FormValue;
  uint64_t LowPC_local;
  DWARFDie *this_local;
  Optional<unsigned_long> Address;
  
  find((Optional<llvm::DWARFFormValue> *)&Offset.Storage.hasVal,this,DW_AT_high_pc);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&Offset.Storage.hasVal);
  if (bVar1) {
    pDVar2 = Optional<llvm::DWARFFormValue>::operator->
                       ((Optional<llvm::DWARFFormValue> *)&Offset.Storage.hasVal);
    OVar5 = DWARFFormValue::getAsAddress(pDVar2);
    this_local = (DWARFDie *)OVar5.Storage.field_0;
    Address.Storage.field_0.empty = OVar5.Storage.hasVal;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&this_local);
    uVar4 = extraout_RDX;
    if (bVar1) goto LAB_02813e75;
    pDVar2 = Optional<llvm::DWARFFormValue>::operator->
                       ((Optional<llvm::DWARFFormValue> *)&Offset.Storage.hasVal);
    OVar5 = DWARFFormValue::getAsUnsignedConstant(pDVar2);
    local_70 = OVar5.Storage.field_0;
    Offset.Storage.field_0.empty = OVar5.Storage.hasVal;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_70.empty);
    if (bVar1) {
      puVar3 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_70);
      local_78 = LowPC + *puVar3;
      Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,&local_78);
      uVar4 = extraout_RDX_00;
      goto LAB_02813e75;
    }
  }
  Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&this_local,None);
  uVar4 = extraout_RDX_01;
LAB_02813e75:
  OVar5.Storage._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  OVar5.Storage.hasVal = (bool)Address.Storage.field_0.empty;
  OVar5.Storage.field_0 =
       (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)this_local;
  return (Optional<unsigned_long>)OVar5.Storage;
}

Assistant:

Optional<uint64_t> DWARFDie::getHighPC(uint64_t LowPC) const {
  if (auto FormValue = find(DW_AT_high_pc)) {
    if (auto Address = FormValue->getAsAddress()) {
      // High PC is an address.
      return Address;
    }
    if (auto Offset = FormValue->getAsUnsignedConstant()) {
      // High PC is an offset from LowPC.
      return LowPC + *Offset;
    }
  }
  return None;
}